

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void sym_Init(time_t now)

{
  int iVar1;
  Symbol *pSVar2;
  char *value;
  tm *ptVar3;
  long in_RDI;
  time_t local_28;
  
  local_28 = in_RDI;
  pSVar2 = createsymbol("@");
  pSVar2->isBuiltin = true;
  pSVar2->hasCallback = true;
  pSVar2->src = (FileStackNode *)0x0;
  pSVar2->fileLine = 1;
  PCSymbol = pSVar2;
  pSVar2->type = SYM_LABEL;
  pSVar2->section = (Section *)0x0;
  (pSVar2->field_8).numCallback = CallbackPC;
  pSVar2 = createsymbol("_NARG");
  pSVar2->isBuiltin = true;
  pSVar2->hasCallback = true;
  pSVar2->src = (FileStackNode *)0x0;
  pSVar2->fileLine = 1;
  _NARGSymbol = pSVar2;
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).numCallback = Callback_NARG;
  pSVar2 = sym_AddVar("_RS",0);
  pSVar2->isBuiltin = true;
  value = get_package_version_string();
  pSVar2 = sym_AddString("__RGBDS_VERSION__",value);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x292,"sym_Init");
  }
  pSVar2->isBuiltin = true;
  pSVar2 = createNonrelocSymbol("__RGBDS_MAJOR__",true);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x293,"sym_Init");
  }
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).value = 0;
  pSVar2->isBuiltin = true;
  pSVar2 = createNonrelocSymbol("__RGBDS_MINOR__",true);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x294,"sym_Init");
  }
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).value = 6;
  pSVar2->isBuiltin = true;
  pSVar2 = createNonrelocSymbol("__RGBDS_PATCH__",true);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x295,"sym_Init");
  }
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).value = 1;
  pSVar2->isBuiltin = true;
  if (in_RDI == -1) {
    warn("Couldn\'t determine current time");
    local_28 = 0;
  }
  ptVar3 = localtime(&local_28);
  strftime(savedTIME,0x100,"\"%H:%M:%S\"",ptVar3);
  strftime(savedDATE,0x100,"\"%d %B %Y\"",ptVar3);
  strftime(savedTIMESTAMP_ISO8601_LOCAL,0x100,"\"%Y-%m-%dT%H:%M:%S%z\"",ptVar3);
  ptVar3 = gmtime(&local_28);
  strftime(savedTIMESTAMP_ISO8601_UTC,0x100,"\"%Y-%m-%dT%H:%M:%SZ\"",ptVar3);
  pSVar2 = sym_AddString("__TIME__",savedTIME);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2ae,"sym_Init");
  }
  pSVar2->isBuiltin = true;
  pSVar2 = sym_AddString("__DATE__",savedDATE);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2af,"sym_Init");
  }
  pSVar2->isBuiltin = true;
  pSVar2 = sym_AddString("__ISO_8601_LOCAL__",savedTIMESTAMP_ISO8601_LOCAL);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b0,"sym_Init");
  }
  pSVar2->isBuiltin = true;
  pSVar2 = sym_AddString("__ISO_8601_UTC__",savedTIMESTAMP_ISO8601_UTC);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b1,"sym_Init");
  }
  pSVar2->isBuiltin = true;
  iVar1 = ptVar3->tm_year;
  pSVar2 = createNonrelocSymbol("__UTC_YEAR__",true);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b3,"sym_Init");
  }
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).value = iVar1 + 0x76c;
  pSVar2->isBuiltin = true;
  iVar1 = ptVar3->tm_mon;
  pSVar2 = createNonrelocSymbol("__UTC_MONTH__",true);
  if (pSVar2 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b4,"sym_Init");
  }
  pSVar2->type = SYM_EQU;
  (pSVar2->field_8).value = iVar1 + 1;
  pSVar2->isBuiltin = true;
  iVar1 = ptVar3->tm_mday;
  pSVar2 = createNonrelocSymbol("__UTC_DAY__",true);
  if (pSVar2 != (Symbol *)0x0) {
    pSVar2->type = SYM_EQU;
    (pSVar2->field_8).value = iVar1;
    pSVar2->isBuiltin = true;
    iVar1 = ptVar3->tm_hour;
    pSVar2 = createNonrelocSymbol("__UTC_HOUR__",true);
    if (pSVar2 == (Symbol *)0x0) {
      __assert_fail("sym",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                    ,0x2b6,"sym_Init");
    }
    pSVar2->type = SYM_EQU;
    (pSVar2->field_8).value = iVar1;
    pSVar2->isBuiltin = true;
    iVar1 = ptVar3->tm_min;
    pSVar2 = createNonrelocSymbol("__UTC_MINUTE__",true);
    if (pSVar2 != (Symbol *)0x0) {
      pSVar2->type = SYM_EQU;
      (pSVar2->field_8).value = iVar1;
      pSVar2->isBuiltin = true;
      iVar1 = ptVar3->tm_sec;
      pSVar2 = createNonrelocSymbol("__UTC_SECOND__",true);
      if (pSVar2 != (Symbol *)0x0) {
        pSVar2->type = SYM_EQU;
        (pSVar2->field_8).value = iVar1;
        pSVar2->isBuiltin = true;
        labelScope = (char *)0x0;
        anonLabelID = 0;
        return;
      }
      __assert_fail("sym",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                    ,0x2b8,"sym_Init");
    }
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b7,"sym_Init");
  }
  __assert_fail("sym",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                ,0x2b5,"sym_Init");
}

Assistant:

void sym_Init(time_t now)
{
	PCSymbol = createBuiltinSymbol("@");
	PCSymbol->type = SYM_LABEL;
	PCSymbol->section = NULL;
	PCSymbol->numCallback = CallbackPC;

	_NARGSymbol = createBuiltinSymbol("_NARG");
	_NARGSymbol->type = SYM_EQU;
	_NARGSymbol->numCallback = Callback_NARG;

	sym_AddVar("_RS", 0)->isBuiltin = true;

#define addSym(fn, name, val) do { \
	struct Symbol *sym = fn(name, val); \
	assert(sym); \
	sym->isBuiltin = true; \
} while (0)
#define addNumber(name, val) addSym(sym_AddEqu, name, val)
#define addString(name, val) addSym(sym_AddString, name, val)

	addString("__RGBDS_VERSION__", get_package_version_string());
	addNumber("__RGBDS_MAJOR__", PACKAGE_VERSION_MAJOR);
	addNumber("__RGBDS_MINOR__", PACKAGE_VERSION_MINOR);
	addNumber("__RGBDS_PATCH__", PACKAGE_VERSION_PATCH);
#ifdef PACKAGE_VERSION_RC
	addNumber("__RGBDS_RC__", PACKAGE_VERSION_RC);
#endif

	if (now == (time_t)-1) {
		warn("Couldn't determine current time");
		// Fall back by pretending we are at the Epoch
		now = 0;
	}

	const struct tm *time_local = localtime(&now);

	strftime(savedTIME, sizeof(savedTIME), "\"%H:%M:%S\"", time_local);
	strftime(savedDATE, sizeof(savedDATE), "\"%d %B %Y\"", time_local);
	strftime(savedTIMESTAMP_ISO8601_LOCAL,
		 sizeof(savedTIMESTAMP_ISO8601_LOCAL), "\"%Y-%m-%dT%H:%M:%S%z\"",
		 time_local);

	const struct tm *time_utc = gmtime(&now);

	strftime(savedTIMESTAMP_ISO8601_UTC,
		 sizeof(savedTIMESTAMP_ISO8601_UTC), "\"%Y-%m-%dT%H:%M:%SZ\"",
		 time_utc);

	addString("__TIME__", savedTIME);
	addString("__DATE__", savedDATE);
	addString("__ISO_8601_LOCAL__", savedTIMESTAMP_ISO8601_LOCAL);
	addString("__ISO_8601_UTC__", savedTIMESTAMP_ISO8601_UTC);

	addNumber("__UTC_YEAR__", time_utc->tm_year + 1900);
	addNumber("__UTC_MONTH__", time_utc->tm_mon + 1);
	addNumber("__UTC_DAY__", time_utc->tm_mday);
	addNumber("__UTC_HOUR__", time_utc->tm_hour);
	addNumber("__UTC_MINUTE__", time_utc->tm_min);
	addNumber("__UTC_SECOND__", time_utc->tm_sec);

#undef addNumber
#undef addString
#undef addSym

	sym_SetCurrentSymbolScope(NULL);
	anonLabelID = 0;
}